

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O0

BranchNode<unsigned_long,_8U,_false> * __thiscall
slang::PoolAllocator<char,192ul,64ul>::
emplace<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
          (PoolAllocator<char,_192UL,_64UL> *this)

{
  PoolAllocator<char,_192UL,_64UL> *in_RDI;
  BranchNode<unsigned_long,_8U,_false> *mem;
  BranchNode<unsigned_long,_8U,_false> *local_20;
  size_t in_stack_fffffffffffffff0;
  
  if (in_RDI->freeList == (FreeNode *)0x0) {
    local_20 = (BranchNode<unsigned_long,_8U,_false> *)
               BumpAllocator::allocate
                         ((BumpAllocator *)in_RDI,in_stack_fffffffffffffff0,(size_t)in_RDI);
  }
  else {
    local_20 = (BranchNode<unsigned_long,_8U,_false> *)PoolAllocator<char,_192UL,_64UL>::pop(in_RDI)
    ;
  }
  memset(local_20,0,0xc0);
  IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>::BranchNode
            ((BranchNode<unsigned_long,_8U,_false> *)0x470a7f);
  return local_20;
}

Assistant:

TSubClass* emplace(Args&&... args) {
        static_assert(sizeof(TSubClass) <= Size);
        static_assert(alignof(TSubClass) <= Align);
        static_assert(std::is_trivially_destructible_v<TSubClass>);
        auto mem = freeList ? reinterpret_cast<TSubClass*>(pop())
                            : reinterpret_cast<TSubClass*>(alloc.allocate(Size, Align));
        return new (mem) TSubClass(std::forward<Args>(args)...);
    }